

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree.cpp
# Opt level: O3

void __thiscall ANNkd_tree::SkeletonTree(ANNkd_tree *this,int n,int dd,int bs)

{
  undefined1 auVar1 [16];
  ANNidxArray pAVar2;
  ulong uVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  this->dim = dd;
  this->n_pts = n;
  this->bkt_size = bs;
  this->root = (ANNkd_ptr)0x0;
  this->pts = (ANNpointArray)0x0;
  uVar3 = 0xffffffffffffffff;
  if (-1 < n) {
    uVar3 = (ulong)(uint)n * 4;
  }
  pAVar2 = (ANNidxArray)operator_new__(uVar3);
  this->pidx = pAVar2;
  auVar1 = _DAT_0010a260;
  if (0 < n) {
    lVar4 = (ulong)(uint)n - 1;
    auVar5._8_4_ = (int)lVar4;
    auVar5._0_8_ = lVar4;
    auVar5._12_4_ = (int)((ulong)lVar4 >> 0x20);
    uVar3 = 0;
    auVar5 = auVar5 ^ _DAT_0010a260;
    auVar6 = _DAT_0010a090;
    do {
      auVar7 = auVar6 ^ auVar1;
      if ((bool)(~(auVar7._4_4_ == auVar5._4_4_ && auVar5._0_4_ < auVar7._0_4_ ||
                  auVar5._4_4_ < auVar7._4_4_) & 1)) {
        pAVar2[uVar3] = (int)uVar3;
      }
      if ((auVar7._12_4_ != auVar5._12_4_ || auVar7._8_4_ <= auVar5._8_4_) &&
          auVar7._12_4_ <= auVar5._12_4_) {
        pAVar2[uVar3 + 1] = (int)uVar3 + 1;
      }
      uVar3 = uVar3 + 2;
      lVar4 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 2;
      auVar6._8_8_ = lVar4 + 2;
    } while ((n + 1U & 0xfffffffe) != uVar3);
  }
  this->bnd_box_lo = (ANNpoint)0x0;
  this->bnd_box_hi = (ANNpoint)0x0;
  if (KD_TRIVIAL == (ANNkd_leaf *)0x0) {
    KD_TRIVIAL = (ANNkd_leaf *)operator_new(0x18);
    (KD_TRIVIAL->super_ANNkd_node)._vptr_ANNkd_node = (_func_int **)&PTR__ANNkd_node_0010cd30;
    KD_TRIVIAL->n_pts = 0;
    KD_TRIVIAL->bkt = IDX_TRIVIAL;
  }
  return;
}

Assistant:

void ANNkd_tree::SkeletonTree(  // construct skeleton tree
    int n,                      // number of points
    int dd,                     // dimension
    int bs)                     // bucket size
{
    dim = dd;  // initialize basic elements
    n_pts = n;
    bkt_size = bs;
    root = NULL;  // no associated tree yet
    pts = NULL;   // no associated points yet

    pidx = new int[n];  // allocate space for point indices
    for (int i = 0; i < n; i++) {
        pidx[i] = i;  // initially identity
    }
    bnd_box_lo = bnd_box_hi = NULL;  // bounding box is nonexistent
    if (KD_TRIVIAL == NULL)          // no trivial leaf node yet?
        KD_TRIVIAL = new ANNkd_leaf(0, IDX_TRIVIAL);  // allocate it
}